

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.h
# Opt level: O2

Point2f __thiscall pbrt::PMJ02BNSampler::Get2D(PMJ02BNSampler *this)

{
  Tuple2<pbrt::Point2,_float> TVar1;
  int iVar2;
  Tuple2<pbrt::Point2,_int> TVar3;
  undefined1 auVar4 [16];
  undefined8 uVar5;
  bool bVar6;
  int sampleIndex;
  uint64_t uVar7;
  int textureIndex;
  float fVar8;
  float fVar9;
  undefined4 extraout_XMM0_Db;
  Point2f PVar10;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  
  iVar2 = this->dimension;
  if ((long)iVar2 < 5) {
    sampleIndex = this->sampleIndex;
    textureIndex = iVar2;
  }
  else {
    uVar7 = MixBits((long)*(int *)(Options + 4) ^
                    ((long)iVar2 << 0x10 |
                    (ulong)(uint)(this->pixel).super_Tuple2<pbrt::Point2,_int>.x << 0x30) ^
                    (ulong)(uint)(this->pixel).super_Tuple2<pbrt::Point2,_int>.y << 0x20);
    sampleIndex = PermutationElement(this->sampleIndex,this->samplesPerPixel,(uint32_t)uVar7);
    textureIndex = this->dimension;
  }
  if (textureIndex == 0) {
    TVar3 = (this->pixel).super_Tuple2<pbrt::Point2,_int>;
    iVar2 = this->pixelTileSize;
    this->dimension = 2;
    TVar1 = this->pixelSamples->ptr
            [((int)((long)((ulong)(uint)(TVar3.y >> 0x1f) << 0x20 | (ulong)TVar3 >> 0x20) %
                   (long)iVar2) * iVar2 +
             (int)((long)((ulong)(uint)(TVar3.x >> 0x1f) << 0x20 | (ulong)TVar3 & 0xffffffff) %
                  (long)iVar2)) * this->samplesPerPixel + sampleIndex].
            super_Tuple2<pbrt::Point2,_float>;
  }
  else {
    fVar8 = BlueNoise(textureIndex,(this->pixel).super_Tuple2<pbrt::Point2,_int>.x,
                      (this->pixel).super_Tuple2<pbrt::Point2,_int>.y);
    fVar9 = BlueNoise(this->dimension + 1,(this->pixel).super_Tuple2<pbrt::Point2,_int>.x,
                      (this->pixel).super_Tuple2<pbrt::Point2,_int>.y);
    PVar10 = GetPMJ02BNSample(iVar2 % 5,sampleIndex);
    auVar4._4_4_ = extraout_XMM0_Db;
    auVar4._0_4_ = fVar8;
    auVar4._8_4_ = extraout_XMM0_Dc;
    auVar4._12_4_ = extraout_XMM0_Dd;
    auVar4 = vinsertps_avx(auVar4,ZEXT416((uint)fVar9),0x10);
    auVar11._0_4_ = auVar4._0_4_ + PVar10.super_Tuple2<pbrt::Point2,_float>.x;
    auVar11._4_4_ = auVar4._4_4_ + PVar10.super_Tuple2<pbrt::Point2,_float>.y;
    auVar11._8_4_ = auVar4._8_4_ + (float)extraout_XMM0_Qb;
    auVar11._12_4_ = auVar4._12_4_ + (float)((ulong)extraout_XMM0_Qb >> 0x20);
    if (1.0 <= auVar11._0_4_) {
      auVar11 = ZEXT416((uint)(auVar11._0_4_ + -1.0));
    }
    auVar4 = vmovshdup_avx(auVar11);
    this->dimension = this->dimension + 2;
    uVar5 = vcmpss_avx512f(SUB6416(ZEXT464(0x3f800000),0),auVar4,6);
    bVar6 = (bool)((byte)uVar5 & 1);
    auVar4 = vinsertps_avx(auVar11,ZEXT416((uint)bVar6 * (int)auVar4._0_4_ +
                                           (uint)!bVar6 * (int)(auVar4._0_4_ + -1.0)),0x10);
    auVar12._8_4_ = 0x3f7fffff;
    auVar12._0_8_ = 0x3f7fffff3f7fffff;
    auVar12._12_4_ = 0x3f7fffff;
    auVar4 = vminps_avx(auVar12,auVar4);
    TVar1 = auVar4._0_8_;
  }
  return (Point2f)TVar1;
}

Assistant:

PBRT_CPU_GPU
    Point2f Get2D() {
        // Don't start permuting until the second time through: when we
        // permute, that breaks the progressive part of the pattern and in
        // turn, convergence is similar to random until the very end. This way,
        // we generally do well for intermediate images as well.
        int index = sampleIndex;
        int pmjInstance = dimension;
        if (pmjInstance >= nPMJ02bnSets) {
            uint64_t hash =
                MixBits(((uint64_t)pixel.x << 48) ^ ((uint64_t)pixel.y << 32) ^
                        ((uint64_t)dimension << 16) ^ GetOptions().seed);
            index = PermutationElement(sampleIndex, samplesPerPixel, hash);
        }

        if (dimension == 0) {
            // special case the pixel sample
            int offset = pixelSampleOffset(Point2i(pixel));
            dimension += 2;
            return (*pixelSamples)[offset + index];
        } else {
            Vector2f cpOffset(BlueNoise(dimension, pixel.x, pixel.y),
                              BlueNoise(dimension + 1, pixel.x, pixel.y));
            Point2f u = GetPMJ02BNSample(pmjInstance % nPMJ02bnSets, index) + cpOffset;
            if (u.x >= 1)
                u.x -= 1;
            if (u.y >= 1)
                u.y -= 1;
            dimension += 2;
            return {std::min(u.x, OneMinusEpsilon), std::min(u.y, OneMinusEpsilon)};
        }
    }